

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

int mctools_exists(mcu8str *rawpath)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  mcu8str path;
  mcu8str s_1;
  stat sinfo;
  char buf [4096];
  mcu8str local_10d8;
  mcu8str local_10c0;
  stat local_10a8;
  char local_1018 [4096];
  
  pcVar2 = rawpath->c_str;
  uVar1 = rawpath->size;
  local_10d8.buflen = uVar1 + 1;
  local_10d8.owns_memory = 0;
  local_10d8.c_str = pcVar2;
  local_10d8.size = uVar1;
  iVar3 = mctools_impl_has_winnamespace(rawpath);
  if (iVar3 != 0) {
    local_10d8.c_str = pcVar2 + 4;
    local_10d8.size = uVar1 - 4;
  }
  local_10c0.owns_memory = 0;
  local_10c0.c_str = local_1018;
  local_1018[0] = '\0';
  local_10c0.size = 0;
  local_10c0.buflen = 0x1000;
  mcu8str_assign(&local_10c0,&local_10d8);
  mctools_pathseps_platform(&local_10c0);
  pcVar2 = local_10c0.c_str;
  iVar3 = stat(local_10c0.c_str,&local_10a8);
  if (pcVar2 != (char *)0x0 && local_10c0.owns_memory != 0) {
    free(pcVar2);
  }
  return (int)(iVar3 == 0);
}

Assistant:

int mctools_exists( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace( rawpath );
#ifdef MC_IS_WINDOWS
    mcwinstr wpath = mc_path2wpath( &path );
    DWORD fa = GetFileAttributesW( wpath.c_str );
    mc_winstr_dealloc( &wpath );
    return fa == INVALID_FILE_ATTRIBUTES ? 0 : 1;
#else
    char buf[4096];
    mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    mcu8str_assign( &native, &path );
    mctools_pathseps_platform( &native );
    struct stat sinfo;
    int res = ( stat( native.c_str, &sinfo) == 0 ) ? 1 : 0;
    mcu8str_dealloc(&native);
    return res;
#endif
  }